

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::~Texture2DGradientTestCase
          (Texture2DGradientTestCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pCVar3;
  ShaderExecutor *pSVar4;
  
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__TextureFilteringTestCase_00d66c70;
  pcVar2 = (this->super_TextureFilteringTestCase).m_shaderSpec.source._M_dataplus._M_p;
  paVar1 = &(this->super_TextureFilteringTestCase).m_shaderSpec.source.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations._M_dataplus._M_p;
  paVar1 = &(this->super_TextureFilteringTestCase).m_shaderSpec.globalDeclarations.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->super_TextureFilteringTestCase).m_shaderSpec.outputs);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->super_TextureFilteringTestCase).m_shaderSpec.inputs);
  pCVar3 = (this->super_TextureFilteringTestCase).m_testCaseData.pba.
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar3 != (pointer)0x0) {
    operator_delete(pCVar3,(long)(this->super_TextureFilteringTestCase).m_testCaseData.pba.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar3);
  }
  pSVar4 = (this->super_TextureFilteringTestCase).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  if (pSVar4 != (ShaderExecutor *)0x0) {
    (*pSVar4->_vptr_ShaderExecutor[1])();
    (this->super_TextureFilteringTestCase).m_executor.
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data.ptr = (ShaderExecutor *)0x0;
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0x188);
  return;
}

Assistant:

Texture2DGradientTestCase (TestContext&			testCtx,
							   const char*			name,
							   const char*			desc,
							   TextureFormat		format,
							   IVec3				dimensions,
							   VkFilter				magFilter,
							   VkFilter				minFilter,
							   VkSamplerMipmapMode	mipmapFilter,
							   VkSamplerAddressMode	wrappingMode,
							   bool					useDerivatives)

		: TextureFilteringTestCase	(testCtx, name, desc)
		, m_format					(format)
		, m_dimensions				(dimensions)
		, m_magFilter				(magFilter)
		, m_minFilter				(minFilter)
		, m_mipmapFilter			(mipmapFilter)
		, m_wrappingMode			(wrappingMode)
		, m_useDerivatives			(useDerivatives)
	{
		m_testCaseData = genTestCaseData();
		initSpec();
	}